

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_winograd_transform_pack4.h
# Opt level: O0

void ncnn::conv3x3s1_winograd63_transform_output_pack4_sse
               (Mat *top_blob_tm,Mat *top_blob,Mat *bias,Option *opt)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  long lVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  undefined8 *puVar35;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  __m128 _out05;
  __m128 _out03;
  __m128 _out01;
  __m128 _out04;
  __m128 _out02;
  __m128 _out00;
  __m128 _tmp135c_1;
  __m128 _tmp024c_1;
  __m128 _tmp135b_1;
  __m128 _tmp024b_1;
  __m128 _tmp135a_1;
  __m128 _tmp024a_1;
  __m128 _tmp07;
  __m128 _tmp06;
  __m128 _tmp05;
  __m128 _tmp04;
  __m128 _tmp03;
  __m128 _tmp02;
  __m128 _tmp01;
  __m128 _tmp00;
  int m_3;
  __m128 _tmp5m;
  __m128 _tmp3m;
  __m128 _tmp1m;
  __m128 _tmp4m;
  __m128 _tmp2m;
  __m128 _tmp0m;
  __m128 _tmp135c;
  __m128 _tmp024c;
  __m128 _tmp135b;
  __m128 _tmp024b;
  __m128 _tmp135a;
  __m128 _tmp024a;
  __m128 _out0tm7;
  __m128 _out0tm6;
  __m128 _out0tm5;
  __m128 _out0tm4;
  __m128 _out0tm3;
  __m128 _out0tm2;
  __m128 _out0tm1;
  __m128 _out0tm0;
  int m_2;
  float *output0;
  float *output0_tm_7;
  float *output0_tm_6;
  float *output0_tm_5;
  float *output0_tm_4;
  float *output0_tm_3;
  float *output0_tm_2;
  float *output0_tm_1;
  float *output0_tm_0;
  int j;
  int i;
  __m128 _v2;
  __m128 _v4;
  __m128 _v8;
  __m128 _v16;
  __m128 _v32;
  float tmp [6] [8] [4];
  __m128 _bias0;
  Mat out0;
  Mat out0_tm;
  int p;
  float *biasptr;
  int tiles;
  int h_tiles;
  int w_tiles;
  int outch;
  int outh;
  int outw;
  Mat *m_1;
  Mat *m;
  undefined8 local_17d8;
  undefined8 uStack_17d0;
  int local_164c;
  int local_14fc;
  undefined8 *local_14f8;
  undefined8 *local_14f0;
  undefined1 (*local_14e8) [16];
  undefined1 (*local_14e0) [16];
  undefined1 (*local_14d8) [16];
  undefined1 (*local_14d0) [16];
  undefined1 (*local_14c8) [16];
  undefined1 (*local_14c0) [16];
  undefined8 *local_14b8;
  int local_14b0;
  int local_14ac;
  undefined8 local_1458 [118];
  int local_10a4;
  float local_cf8;
  float fStack_cf4;
  float fStack_cf0;
  float fStack_cec;
  float local_c58;
  float fStack_c54;
  float fStack_c50;
  float fStack_c4c;
  float local_c18;
  float fStack_c14;
  float fStack_c10;
  float fStack_c0c;
  float local_c08;
  float fStack_c04;
  float fStack_c00;
  float fStack_bfc;
  float local_bf8;
  float fStack_bf4;
  float fStack_bf0;
  float fStack_bec;
  float local_be8;
  float fStack_be4;
  float fStack_be0;
  float fStack_bdc;
  float local_bd8;
  float fStack_bd4;
  float fStack_bd0;
  float fStack_bcc;
  float local_bc8;
  float fStack_bc4;
  float fStack_bc0;
  float fStack_bbc;
  float local_bb8;
  float fStack_bb4;
  float fStack_bb0;
  float fStack_bac;
  float local_b78;
  float fStack_b74;
  float fStack_b70;
  float fStack_b6c;
  float local_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  float local_b28;
  float fStack_b24;
  float fStack_b20;
  float fStack_b1c;
  float local_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float local_b08;
  float fStack_b04;
  float fStack_b00;
  float fStack_afc;
  float local_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  float local_ae8;
  float fStack_ae4;
  float fStack_ae0;
  float fStack_adc;
  float local_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float local_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float local_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  lVar31 = in_RSI[7];
  iVar32 = iVar1 / 6;
  iVar33 = (int)in_RSI[6] / 6;
  iVar34 = iVar32 * iVar33;
  lVar3 = *in_RDX;
  for (local_10a4 = 0; local_10a4 < (int)lVar31; local_10a4 = local_10a4 + 1) {
    lVar4 = *in_RDI;
    lVar5 = in_RDI[8];
    lVar6 = in_RDI[2];
    iVar2 = *(int *)((long)in_RSI + 0x2c);
    lVar7 = *in_RSI;
    lVar8 = in_RSI[8];
    lVar9 = in_RSI[2];
    lVar10 = in_RSI[2];
    if (lVar3 == 0) {
      local_17d8 = 0;
      uStack_17d0 = 0;
    }
    else {
      puVar35 = (undefined8 *)(lVar3 + (long)(local_10a4 << 2) * 4);
      local_17d8 = *puVar35;
      uStack_17d0 = puVar35[1];
    }
    local_1458[0x60] = local_17d8;
    for (local_14ac = 0; local_14ac < iVar33; local_14ac = local_14ac + 1) {
      for (local_14b0 = 0; local_14b0 < iVar32; local_14b0 = local_14b0 + 1) {
        local_14b8 = (undefined8 *)
                     (lVar4 + lVar5 * local_10a4 * lVar6 +
                     (long)((local_14ac * iVar32 + local_14b0) * 4) * 4);
        local_14c0 = (undefined1 (*) [16])((long)local_14b8 + (long)(iVar34 * 4) * 4);
        local_14c8 = (undefined1 (*) [16])((long)local_14b8 + (long)(iVar34 * 8) * 4);
        local_14d0 = (undefined1 (*) [16])((long)local_14b8 + (long)(iVar34 * 0xc) * 4);
        local_14d8 = (undefined1 (*) [16])((long)local_14b8 + (long)(iVar34 * 0x10) * 4);
        local_14e0 = (undefined1 (*) [16])((long)local_14b8 + (long)(iVar34 * 0x14) * 4);
        local_14e8 = (undefined1 (*) [16])((long)local_14b8 + (long)(iVar34 * 0x18) * 4);
        local_14f0 = (undefined8 *)((long)local_14b8 + (long)(iVar34 * 0x1c) * 4);
        local_14f8 = (undefined8 *)
                     (lVar7 + lVar8 * local_10a4 * lVar9 +
                      (long)iVar2 * (long)(local_14ac * 6) * lVar10 + (long)(local_14b0 * 0x18) * 4)
        ;
        for (local_14fc = 0; local_14fc < 8; local_14fc = local_14fc + 1) {
          uVar14 = *local_14f0;
          uVar15 = local_14f0[1];
          local_ad8 = (float)*(undefined8 *)*local_14c0;
          fStack_ad4 = (float)((ulong)*(undefined8 *)*local_14c0 >> 0x20);
          fStack_ad0 = (float)*(undefined8 *)(*local_14c0 + 8);
          fStack_acc = (float)((ulong)*(undefined8 *)(*local_14c0 + 8) >> 0x20);
          local_ae8 = (float)*(undefined8 *)*local_14c8;
          fStack_ae4 = (float)((ulong)*(undefined8 *)*local_14c8 >> 0x20);
          fStack_ae0 = (float)*(undefined8 *)(*local_14c8 + 8);
          fStack_adc = (float)((ulong)*(undefined8 *)(*local_14c8 + 8) >> 0x20);
          local_ad8 = local_ad8 + local_ae8;
          fStack_ad4 = fStack_ad4 + fStack_ae4;
          fStack_ad0 = fStack_ad0 + fStack_ae0;
          fStack_acc = fStack_acc + fStack_adc;
          auVar11 = vsubps_avx(*local_14c0,*local_14c8);
          local_af8 = (float)*(undefined8 *)*local_14d0;
          fStack_af4 = (float)((ulong)*(undefined8 *)*local_14d0 >> 0x20);
          fStack_af0 = (float)*(undefined8 *)(*local_14d0 + 8);
          fStack_aec = (float)((ulong)*(undefined8 *)(*local_14d0 + 8) >> 0x20);
          local_b08 = (float)*(undefined8 *)*local_14d8;
          fStack_b04 = (float)((ulong)*(undefined8 *)*local_14d8 >> 0x20);
          fStack_b00 = (float)*(undefined8 *)(*local_14d8 + 8);
          fStack_afc = (float)((ulong)*(undefined8 *)(*local_14d8 + 8) >> 0x20);
          local_af8 = local_af8 + local_b08;
          fStack_af4 = fStack_af4 + fStack_b04;
          fStack_af0 = fStack_af0 + fStack_b00;
          fStack_aec = fStack_aec + fStack_afc;
          auVar12 = vsubps_avx(*local_14d0,*local_14d8);
          local_b18 = (float)*(undefined8 *)*local_14e0;
          fStack_b14 = (float)((ulong)*(undefined8 *)*local_14e0 >> 0x20);
          fStack_b10 = (float)*(undefined8 *)(*local_14e0 + 8);
          fStack_b0c = (float)((ulong)*(undefined8 *)(*local_14e0 + 8) >> 0x20);
          local_b28 = (float)*(undefined8 *)*local_14e8;
          fStack_b24 = (float)((ulong)*(undefined8 *)*local_14e8 >> 0x20);
          fStack_b20 = (float)*(undefined8 *)(*local_14e8 + 8);
          fStack_b1c = (float)((ulong)*(undefined8 *)(*local_14e8 + 8) >> 0x20);
          local_b18 = local_b18 + local_b28;
          fStack_b14 = fStack_b14 + fStack_b24;
          fStack_b10 = fStack_b10 + fStack_b20;
          fStack_b0c = fStack_b0c + fStack_b1c;
          auVar13 = vsubps_avx(*local_14e0,*local_14e8);
          local_b38 = (float)*local_14b8;
          fStack_b34 = (float)((ulong)*local_14b8 >> 0x20);
          fStack_b30 = (float)local_14b8[1];
          fStack_b2c = (float)((ulong)local_14b8[1] >> 0x20);
          local_1458[(long)local_14fc * 2] =
               CONCAT44(fStack_b34 + fStack_ad4 + fStack_b14 * 32.0 + fStack_af4,
                        local_b38 + local_ad8 + local_b18 * 32.0 + local_af8);
          local_1458[(long)local_14fc * 2 + 1] =
               CONCAT44(fStack_b2c + fStack_acc + fStack_b0c * 32.0 + fStack_aec,
                        fStack_b30 + fStack_ad0 + fStack_b10 * 32.0 + fStack_af0);
          local_1458[(long)local_14fc * 2 + 0x20] =
               CONCAT44(fStack_b14 * 8.0 + fStack_af4 * 4.0 + fStack_ad4,
                        local_b18 * 8.0 + local_af8 * 4.0 + local_ad8);
          local_1458[(long)local_14fc * 2 + 0x21] =
               CONCAT44(fStack_b0c * 8.0 + fStack_aec * 4.0 + fStack_acc,
                        fStack_b10 * 8.0 + fStack_af0 * 4.0 + fStack_ad0);
          local_1458[(long)local_14fc * 2 + 0x40] =
               CONCAT44(fStack_b14 * 2.0 + fStack_af4 * 16.0 + fStack_ad4,
                        local_b18 * 2.0 + local_af8 * 16.0 + local_ad8);
          local_1458[(long)local_14fc * 2 + 0x41] =
               CONCAT44(fStack_b0c * 2.0 + fStack_aec * 16.0 + fStack_acc,
                        fStack_b10 * 2.0 + fStack_af0 * 16.0 + fStack_ad0);
          local_3e8 = auVar12._0_4_;
          fStack_3e4 = auVar12._4_4_;
          fStack_3e0 = auVar12._8_4_;
          fStack_3dc = auVar12._12_4_;
          local_638 = auVar11._0_4_;
          fStack_634 = auVar11._4_4_;
          fStack_630 = auVar11._8_4_;
          fStack_62c = auVar11._12_4_;
          local_3c8 = auVar13._0_4_;
          fStack_3c4 = auVar13._4_4_;
          fStack_3c0 = auVar13._8_4_;
          fStack_3bc = auVar13._12_4_;
          local_b78 = (float)uVar14;
          fStack_b74 = (float)((ulong)uVar14 >> 0x20);
          fStack_b70 = (float)uVar15;
          fStack_b6c = (float)((ulong)uVar15 >> 0x20);
          local_1458[(long)local_14fc * 2 + 0x10] =
               CONCAT44(fStack_3c4 * 16.0 + fStack_3e4 * 2.0 + fStack_634,
                        local_3c8 * 16.0 + local_3e8 * 2.0 + local_638);
          local_1458[(long)local_14fc * 2 + 0x11] =
               CONCAT44(fStack_3bc * 16.0 + fStack_3dc * 2.0 + fStack_62c,
                        fStack_3c0 * 16.0 + fStack_3e0 * 2.0 + fStack_630);
          local_1458[(long)local_14fc * 2 + 0x30] =
               CONCAT44(fStack_3c4 * 4.0 + fStack_3e4 * 8.0 + fStack_634,
                        local_3c8 * 4.0 + local_3e8 * 8.0 + local_638);
          local_1458[(long)local_14fc * 2 + 0x31] =
               CONCAT44(fStack_3bc * 4.0 + fStack_3dc * 8.0 + fStack_62c,
                        fStack_3c0 * 4.0 + fStack_3e0 * 8.0 + fStack_630);
          local_1458[(long)local_14fc * 2 + 0x50] =
               CONCAT44(fStack_b74 + fStack_634 + fStack_3e4 * 32.0 + fStack_3c4,
                        local_b78 + local_638 + local_3e8 * 32.0 + local_3c8);
          local_1458[(long)local_14fc * 2 + 0x51] =
               CONCAT44(fStack_b6c + fStack_62c + fStack_3dc * 32.0 + fStack_3bc,
                        fStack_b70 + fStack_630 + fStack_3e0 * 32.0 + fStack_3c0);
          local_14b8 = (undefined8 *)((long)local_14b8 + (long)(iVar34 * 0x20) * 4);
          local_14c0 = (undefined1 (*) [16])(*local_14c0 + (long)(iVar34 * 0x20) * 4);
          local_14c8 = (undefined1 (*) [16])(*local_14c8 + (long)(iVar34 * 0x20) * 4);
          local_14d0 = (undefined1 (*) [16])(*local_14d0 + (long)(iVar34 * 0x20) * 4);
          local_14d8 = (undefined1 (*) [16])(*local_14d8 + (long)(iVar34 * 0x20) * 4);
          local_14e0 = (undefined1 (*) [16])(*local_14e0 + (long)(iVar34 * 0x20) * 4);
          local_14e8 = (undefined1 (*) [16])(*local_14e8 + (long)(iVar34 * 0x20) * 4);
          local_14f0 = (undefined8 *)((long)local_14f0 + (long)(iVar34 * 0x20) * 4);
        }
        for (local_164c = 0; local_164c < 6; local_164c = local_164c + 1) {
          uVar14 = local_1458[(long)local_164c * 0x10 + 2];
          uVar15 = local_1458[(long)local_164c * 0x10 + 3];
          uVar16 = local_1458[(long)local_164c * 0x10 + 4];
          uVar17 = local_1458[(long)local_164c * 0x10 + 5];
          uVar18 = local_1458[(long)local_164c * 0x10 + 6];
          uVar19 = local_1458[(long)local_164c * 0x10 + 7];
          uVar20 = local_1458[(long)local_164c * 0x10 + 8];
          uVar21 = local_1458[(long)local_164c * 0x10 + 9];
          uVar22 = local_1458[(long)local_164c * 0x10 + 10];
          uVar23 = local_1458[(long)local_164c * 0x10 + 0xb];
          uVar24 = local_1458[(long)local_164c * 0x10 + 0xc];
          uVar25 = local_1458[(long)local_164c * 0x10 + 0xd];
          uVar26 = local_1458[(long)local_164c * 0x10 + 0xe];
          uVar27 = local_1458[(long)local_164c * 0x10 + 0xf];
          local_bb8 = (float)uVar14;
          fStack_bb4 = (float)((ulong)uVar14 >> 0x20);
          fStack_bb0 = (float)uVar15;
          fStack_bac = (float)((ulong)uVar15 >> 0x20);
          local_bc8 = (float)uVar16;
          fStack_bc4 = (float)((ulong)uVar16 >> 0x20);
          fStack_bc0 = (float)uVar17;
          fStack_bbc = (float)((ulong)uVar17 >> 0x20);
          local_bb8 = local_bb8 + local_bc8;
          fStack_bb4 = fStack_bb4 + fStack_bc4;
          fStack_bb0 = fStack_bb0 + fStack_bc0;
          fStack_bac = fStack_bac + fStack_bbc;
          auVar30._8_8_ = uVar15;
          auVar30._0_8_ = uVar14;
          auVar11._8_8_ = uVar17;
          auVar11._0_8_ = uVar16;
          auVar11 = vsubps_avx(auVar30,auVar11);
          local_bd8 = (float)uVar18;
          fStack_bd4 = (float)((ulong)uVar18 >> 0x20);
          fStack_bd0 = (float)uVar19;
          fStack_bcc = (float)((ulong)uVar19 >> 0x20);
          local_be8 = (float)uVar20;
          fStack_be4 = (float)((ulong)uVar20 >> 0x20);
          fStack_be0 = (float)uVar21;
          fStack_bdc = (float)((ulong)uVar21 >> 0x20);
          local_bd8 = local_bd8 + local_be8;
          fStack_bd4 = fStack_bd4 + fStack_be4;
          fStack_bd0 = fStack_bd0 + fStack_be0;
          fStack_bcc = fStack_bcc + fStack_bdc;
          auVar29._8_8_ = uVar19;
          auVar29._0_8_ = uVar18;
          auVar12._8_8_ = uVar21;
          auVar12._0_8_ = uVar20;
          auVar12 = vsubps_avx(auVar29,auVar12);
          local_bf8 = (float)uVar22;
          fStack_bf4 = (float)((ulong)uVar22 >> 0x20);
          fStack_bf0 = (float)uVar23;
          fStack_bec = (float)((ulong)uVar23 >> 0x20);
          local_c08 = (float)uVar24;
          fStack_c04 = (float)((ulong)uVar24 >> 0x20);
          fStack_c00 = (float)uVar25;
          fStack_bfc = (float)((ulong)uVar25 >> 0x20);
          local_bf8 = local_bf8 + local_c08;
          fStack_bf4 = fStack_bf4 + fStack_c04;
          fStack_bf0 = fStack_bf0 + fStack_c00;
          fStack_bec = fStack_bec + fStack_bfc;
          auVar28._8_8_ = uVar23;
          auVar28._0_8_ = uVar22;
          auVar13._8_8_ = uVar25;
          auVar13._0_8_ = uVar24;
          auVar13 = vsubps_avx(auVar28,auVar13);
          local_c18 = (float)local_1458[(long)local_164c * 0x10];
          fStack_c14 = (float)((ulong)local_1458[(long)local_164c * 0x10] >> 0x20);
          fStack_c10 = (float)local_1458[(long)local_164c * 0x10 + 1];
          fStack_c0c = (float)((ulong)local_1458[(long)local_164c * 0x10 + 1] >> 0x20);
          local_c58 = (float)local_1458[0x60];
          fStack_c54 = (float)((ulong)local_1458[0x60] >> 0x20);
          fStack_c50 = (float)uStack_17d0;
          fStack_c4c = (float)((ulong)uStack_17d0 >> 0x20);
          *local_14f8 = CONCAT44(fStack_c54 +
                                 fStack_c14 + fStack_bb4 + fStack_bf4 * 32.0 + fStack_bd4,
                                 local_c58 + local_c18 + local_bb8 + local_bf8 * 32.0 + local_bd8);
          local_14f8[1] =
               CONCAT44(fStack_c4c + fStack_c0c + fStack_bac + fStack_bec * 32.0 + fStack_bcc,
                        fStack_c50 + fStack_c10 + fStack_bb0 + fStack_bf0 * 32.0 + fStack_bd0);
          local_14f8[4] =
               CONCAT44(fStack_c54 + fStack_bf4 * 8.0 + fStack_bd4 * 4.0 + fStack_bb4,
                        local_c58 + local_bf8 * 8.0 + local_bd8 * 4.0 + local_bb8);
          local_14f8[5] =
               CONCAT44(fStack_c4c + fStack_bec * 8.0 + fStack_bcc * 4.0 + fStack_bac,
                        fStack_c50 + fStack_bf0 * 8.0 + fStack_bd0 * 4.0 + fStack_bb0);
          local_14f8[8] =
               CONCAT44(fStack_c54 + fStack_bf4 * 2.0 + fStack_bd4 * 16.0 + fStack_bb4,
                        local_c58 + local_bf8 * 2.0 + local_bd8 * 16.0 + local_bb8);
          local_14f8[9] =
               CONCAT44(fStack_c4c + fStack_bec * 2.0 + fStack_bcc * 16.0 + fStack_bac,
                        fStack_c50 + fStack_bf0 * 2.0 + fStack_bd0 * 16.0 + fStack_bb0);
          local_2a8 = auVar12._0_4_;
          fStack_2a4 = auVar12._4_4_;
          fStack_2a0 = auVar12._8_4_;
          fStack_29c = auVar12._12_4_;
          local_958 = auVar11._0_4_;
          fStack_954 = auVar11._4_4_;
          fStack_950 = auVar11._8_4_;
          fStack_94c = auVar11._12_4_;
          local_288 = auVar13._0_4_;
          fStack_284 = auVar13._4_4_;
          fStack_280 = auVar13._8_4_;
          fStack_27c = auVar13._12_4_;
          local_cf8 = (float)uVar26;
          fStack_cf4 = (float)((ulong)uVar26 >> 0x20);
          fStack_cf0 = (float)uVar27;
          fStack_cec = (float)((ulong)uVar27 >> 0x20);
          local_14f8[2] =
               CONCAT44(fStack_c54 + fStack_284 * 16.0 + fStack_2a4 * 2.0 + fStack_954,
                        local_c58 + local_288 * 16.0 + local_2a8 * 2.0 + local_958);
          local_14f8[3] =
               CONCAT44(fStack_c4c + fStack_27c * 16.0 + fStack_29c * 2.0 + fStack_94c,
                        fStack_c50 + fStack_280 * 16.0 + fStack_2a0 * 2.0 + fStack_950);
          local_14f8[6] =
               CONCAT44(fStack_c54 + fStack_284 * 4.0 + fStack_2a4 * 8.0 + fStack_954,
                        local_c58 + local_288 * 4.0 + local_2a8 * 8.0 + local_958);
          local_14f8[7] =
               CONCAT44(fStack_c4c + fStack_27c * 4.0 + fStack_29c * 8.0 + fStack_94c,
                        fStack_c50 + fStack_280 * 4.0 + fStack_2a0 * 8.0 + fStack_950);
          local_14f8[10] =
               CONCAT44(fStack_c54 + fStack_cf4 + fStack_954 + fStack_2a4 * 32.0 + fStack_284,
                        local_c58 + local_cf8 + local_958 + local_2a8 * 32.0 + local_288);
          local_14f8[0xb] =
               CONCAT44(fStack_c4c + fStack_cec + fStack_94c + fStack_29c * 32.0 + fStack_27c,
                        fStack_c50 + fStack_cf0 + fStack_950 + fStack_2a0 * 32.0 + fStack_280);
          local_14f8 = (undefined8 *)((long)local_14f8 + (long)(iVar1 << 2) * 4);
        }
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_transform_output_pack4_sse(const Mat& top_blob_tm, Mat& top_blob, const Mat& bias, const Option& opt)
{
    const int outw = top_blob.w;
    const int outh = top_blob.h;
    const int outch = top_blob.c;

    const int w_tiles = outw / 6;
    const int h_tiles = outh / 6;
    const int tiles = w_tiles * h_tiles;

    const float* biasptr = bias;

    // const float otm[6][8] = {
    //     {1.0f,  1.0f,   1.0f,   1.0f,   1.0f,  32.0f, 32.0f, 0.0f},
    //     {0.0f,  1.0f,  -1.0f,   2.0f,  -2.0f,  16.0f,-16.0f, 0.0f},
    //     {0.0f,  1.0f,   1.0f,   4.0f,   4.0f,   8.0f,  8.0f, 0.0f},
    //     {0.0f,  1.0f,  -1.0f,   8.0f,  -8.0f,   4.0f, -4.0f, 0.0f},
    //     {0.0f,  1.0f,   1.0f,  16.0f,  16.0f,   2.0f,  2.0f, 0.0f},
    //     {0.0f,  1.0f,  -1.0f,  32.0f, -32.0f,   1.0f, -1.0f, 1.0f}
    // };

    // 0 = r0 + (r1 + r2) + (r3 + r4)     + (r5 + r6) * 32
    // 1 =      (r1 - r2) + (r3 - r4) * 2 + (r5 - r6) * 16
    // 2 =      (r1 + r2) + (r3 + r4) * 4 + (r5 + r6) * 8
    // 3 =      (r1 - r2) + (r3 - r4) * 8 + (r5 - r6) * 4
    // 4 =      (r1 + r2) + (r3 + r4) * 16+ (r5 + r6) * 2
    // 5 = r7 + (r1 - r2) + (r3 - r4) * 32+ (r5 - r6)

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        const Mat out0_tm = top_blob_tm.channel(p);
        Mat out0 = top_blob.channel(p);

        __m128 _bias0 = biasptr ? _mm_loadu_ps(biasptr + p * 4) : _mm_setzero_ps();

#ifdef _MSC_VER
        __declspec(align(16))
#else
        __attribute__((aligned(16)))
#endif
        float tmp[6][8][4];

        __m128 _v32 = _mm_set1_ps(32.f);
        __m128 _v16 = _mm_set1_ps(16.f);
        __m128 _v8 = _mm_set1_ps(8.f);
        __m128 _v4 = _mm_set1_ps(4.f);
        __m128 _v2 = _mm_set1_ps(2.f);

        // tile
        for (int i = 0; i < h_tiles; i++)
        {
            for (int j = 0; j < w_tiles; j++)
            {
                const float* output0_tm_0 = (const float*)out0_tm + (i * w_tiles + j) * 4;
                const float* output0_tm_1 = output0_tm_0 + tiles * 4;
                const float* output0_tm_2 = output0_tm_0 + tiles * 4 * 2;
                const float* output0_tm_3 = output0_tm_0 + tiles * 4 * 3;
                const float* output0_tm_4 = output0_tm_0 + tiles * 4 * 4;
                const float* output0_tm_5 = output0_tm_0 + tiles * 4 * 5;
                const float* output0_tm_6 = output0_tm_0 + tiles * 4 * 6;
                const float* output0_tm_7 = output0_tm_0 + tiles * 4 * 7;

                float* output0 = out0.row(i * 6) + (j * 6) * 4;

                for (int m = 0; m < 8; m++)
                {
                    __m128 _out0tm0 = _mm_load_ps(output0_tm_0);
                    __m128 _out0tm1 = _mm_load_ps(output0_tm_1);
                    __m128 _out0tm2 = _mm_load_ps(output0_tm_2);
                    __m128 _out0tm3 = _mm_load_ps(output0_tm_3);
                    __m128 _out0tm4 = _mm_load_ps(output0_tm_4);
                    __m128 _out0tm5 = _mm_load_ps(output0_tm_5);
                    __m128 _out0tm6 = _mm_load_ps(output0_tm_6);
                    __m128 _out0tm7 = _mm_load_ps(output0_tm_7);

                    __m128 _tmp024a = _mm_add_ps(_out0tm1, _out0tm2);
                    __m128 _tmp135a = _mm_sub_ps(_out0tm1, _out0tm2);

                    __m128 _tmp024b = _mm_add_ps(_out0tm3, _out0tm4);
                    __m128 _tmp135b = _mm_sub_ps(_out0tm3, _out0tm4);

                    __m128 _tmp024c = _mm_add_ps(_out0tm5, _out0tm6);
                    __m128 _tmp135c = _mm_sub_ps(_out0tm5, _out0tm6);

                    __m128 _tmp0m = _mm_add_ps(_mm_add_ps(_out0tm0, _tmp024a), _mm_comp_fmadd_ps(_v32, _tmp024c, _tmp024b));
                    __m128 _tmp2m = _mm_comp_fmadd_ps(_v8, _tmp024c, _mm_comp_fmadd_ps(_v4, _tmp024b, _tmp024a));
                    __m128 _tmp4m = _mm_comp_fmadd_ps(_v2, _tmp024c, _mm_comp_fmadd_ps(_v16, _tmp024b, _tmp024a));
                    _mm_store_ps(tmp[0][m], _tmp0m);
                    _mm_store_ps(tmp[2][m], _tmp2m);
                    _mm_store_ps(tmp[4][m], _tmp4m);

                    __m128 _tmp1m = _mm_comp_fmadd_ps(_v16, _tmp135c, _mm_comp_fmadd_ps(_v2, _tmp135b, _tmp135a));
                    __m128 _tmp3m = _mm_comp_fmadd_ps(_v4, _tmp135c, _mm_comp_fmadd_ps(_v8, _tmp135b, _tmp135a));
                    __m128 _tmp5m = _mm_add_ps(_mm_add_ps(_out0tm7, _tmp135a), _mm_comp_fmadd_ps(_v32, _tmp135b, _tmp135c));
                    _mm_store_ps(tmp[1][m], _tmp1m);
                    _mm_store_ps(tmp[3][m], _tmp3m);
                    _mm_store_ps(tmp[5][m], _tmp5m);

                    output0_tm_0 += tiles * 4 * 8;
                    output0_tm_1 += tiles * 4 * 8;
                    output0_tm_2 += tiles * 4 * 8;
                    output0_tm_3 += tiles * 4 * 8;
                    output0_tm_4 += tiles * 4 * 8;
                    output0_tm_5 += tiles * 4 * 8;
                    output0_tm_6 += tiles * 4 * 8;
                    output0_tm_7 += tiles * 4 * 8;
                }

                for (int m = 0; m < 6; m++)
                {
                    __m128 _tmp00 = _mm_load_ps(tmp[m][0]);
                    __m128 _tmp01 = _mm_load_ps(tmp[m][1]);
                    __m128 _tmp02 = _mm_load_ps(tmp[m][2]);
                    __m128 _tmp03 = _mm_load_ps(tmp[m][3]);
                    __m128 _tmp04 = _mm_load_ps(tmp[m][4]);
                    __m128 _tmp05 = _mm_load_ps(tmp[m][5]);
                    __m128 _tmp06 = _mm_load_ps(tmp[m][6]);
                    __m128 _tmp07 = _mm_load_ps(tmp[m][7]);

                    __m128 _tmp024a = _mm_add_ps(_tmp01, _tmp02);
                    __m128 _tmp135a = _mm_sub_ps(_tmp01, _tmp02);

                    __m128 _tmp024b = _mm_add_ps(_tmp03, _tmp04);
                    __m128 _tmp135b = _mm_sub_ps(_tmp03, _tmp04);

                    __m128 _tmp024c = _mm_add_ps(_tmp05, _tmp06);
                    __m128 _tmp135c = _mm_sub_ps(_tmp05, _tmp06);

                    __m128 _out00 = _mm_add_ps(_bias0, _mm_add_ps(_mm_add_ps(_tmp00, _tmp024a), _mm_comp_fmadd_ps(_v32, _tmp024c, _tmp024b)));
                    __m128 _out02 = _mm_add_ps(_bias0, _mm_comp_fmadd_ps(_v8, _tmp024c, _mm_comp_fmadd_ps(_v4, _tmp024b, _tmp024a)));
                    __m128 _out04 = _mm_add_ps(_bias0, _mm_comp_fmadd_ps(_v2, _tmp024c, _mm_comp_fmadd_ps(_v16, _tmp024b, _tmp024a)));
                    _mm_store_ps(output0, _out00);
                    _mm_store_ps(output0 + 4 * 2, _out02);
                    _mm_store_ps(output0 + 4 * 4, _out04);

                    __m128 _out01 = _mm_add_ps(_bias0, _mm_comp_fmadd_ps(_v16, _tmp135c, _mm_comp_fmadd_ps(_v2, _tmp135b, _tmp135a)));
                    __m128 _out03 = _mm_add_ps(_bias0, _mm_comp_fmadd_ps(_v4, _tmp135c, _mm_comp_fmadd_ps(_v8, _tmp135b, _tmp135a)));
                    __m128 _out05 = _mm_add_ps(_bias0, _mm_add_ps(_mm_add_ps(_tmp07, _tmp135a), _mm_comp_fmadd_ps(_v32, _tmp135b, _tmp135c)));
                    _mm_store_ps(output0 + 4, _out01);
                    _mm_store_ps(output0 + 4 * 3, _out03);
                    _mm_store_ps(output0 + 4 * 5, _out05);

                    output0 += outw * 4;
                }
            }
        }
    }
}